

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  pointer ppFVar1;
  Func *func;
  pointer ppEVar2;
  pointer ppGVar3;
  pointer ppTVar4;
  pointer ppEVar5;
  ElemSegment *pEVar6;
  pointer piVar7;
  pointer ppDVar8;
  DataSegment *pDVar9;
  pointer ppVVar10;
  ulong uVar11;
  pointer ppEVar12;
  pointer ppFVar13;
  pointer ppEVar14;
  pointer ppGVar15;
  pointer ppTVar16;
  pointer ppDVar17;
  ExprList *elem_expr;
  pointer piVar18;
  pointer ppVVar19;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->elem_segment_bindings,"elem");
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->type_bindings,"type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->tag_bindings,"tag");
  ppFVar13 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar13 != ppFVar1) {
    do {
      func = *ppFVar13;
      this->current_func_ = func;
      if ((func->decl).has_func_type == true) {
        ResolveVar(this,&this->current_module_->type_bindings,&(func->decl).type_var,"type");
      }
      local_38 = std::
                 _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/resolve-names.cc:510:33)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/resolve-names.cc:510:33)>
                 ::_M_manager;
      local_50._M_unused._0_8_ = (undefined8)func;
      local_50._8_8_ = this;
      BindingHash::FindDuplicates(&func->bindings,(DuplicateCallback *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      ExprVisitor::VisitFunc(&this->visitor_,func);
      this->current_func_ = (Func *)0x0;
      ppFVar13 = ppFVar13 + 1;
    } while (ppFVar13 != ppFVar1);
  }
  ppEVar2 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar14 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar14 != ppEVar2; ppEVar14 = ppEVar14 + 1) {
    uVar11 = (ulong)(*ppEVar14)->kind;
    if (uVar11 < 5) {
      ResolveVar(this,(BindingHash *)
                      ((long)&(this->current_module_->loc).filename._M_len +
                      *(long *)(&DAT_00181d58 + uVar11 * 8)),&(*ppEVar14)->var,
                 &DAT_00181d80 + *(int *)(&DAT_00181d80 + uVar11 * 4));
    }
  }
  ppGVar15 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar3 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar15 != ppGVar3) {
    do {
      ExprVisitor::VisitExprList(&this->visitor_,&(*ppGVar15)->init_expr);
      ppGVar15 = ppGVar15 + 1;
    } while (ppGVar15 != ppGVar3);
  }
  ppTVar4 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar16 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppTVar16 != ppTVar4;
      ppTVar16 = ppTVar16 + 1) {
    if (((*ppTVar16)->decl).has_func_type == true) {
      ResolveVar(this,&this->current_module_->type_bindings,&((*ppTVar16)->decl).type_var,"type");
    }
  }
  ppEVar12 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppEVar5 = (module->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar12 != ppEVar5) {
    do {
      pEVar6 = *ppEVar12;
      ResolveVar(this,&this->current_module_->table_bindings,&pEVar6->table_var,"table");
      ExprVisitor::VisitExprList(&this->visitor_,&pEVar6->offset);
      piVar7 = (pEVar6->elem_exprs).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (piVar18 = (pEVar6->elem_exprs).
                     super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; piVar18 != piVar7;
          piVar18 = piVar18 + 1) {
        if ((piVar18->size_ == 1) && (piVar18->first_->type_ == RefFunc)) {
          ResolveVar(this,&this->current_module_->func_bindings,(Var *)(piVar18->first_ + 1),
                     "function");
        }
      }
      ppEVar12 = ppEVar12 + 1;
    } while (ppEVar12 != ppEVar5);
  }
  ppDVar17 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar8 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar17 != ppDVar8) {
    do {
      pDVar9 = *ppDVar17;
      ResolveVar(this,&this->current_module_->memory_bindings,&pDVar9->memory_var,"memory");
      ExprVisitor::VisitExprList(&this->visitor_,&pDVar9->offset);
      ppDVar17 = ppDVar17 + 1;
    } while (ppDVar17 != ppDVar8);
  }
  ppVVar10 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppVVar19 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVVar19 != ppVVar10;
      ppVVar19 = ppVVar19 + 1) {
    ResolveVar(this,&this->current_module_->func_bindings,*ppVVar19,"function");
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->elem_segment_bindings, "elem");
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->type_bindings, "type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->tag_bindings, "tag");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (Tag* tag : module->tags)
    VisitTag(tag);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}